

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# BlenderCustomData.cpp
# Opt level: O0

bool Assimp::Blender::readCustomData
               (shared_ptr<Assimp::Blender::ElemBase> *out,int cdtype,size_t cnt,FileDatabase *db)

{
  PRead p_Var1;
  _func_void_ElemBase_ptr *__d;
  __shared_ptr<Assimp::Blender::ElemBase,_(__gnu_cxx::_Lock_policy)2> *this;
  bool bVar2;
  Error *this_00;
  basic_formatter<char,std::char_traits<char>,std::allocator<char>> *pbVar3;
  basic_formatter *this_01;
  reference pvVar4;
  ElemBase *__p;
  element_type *peVar5;
  CustomDataTypeDescription cdtd;
  basic_formatter<char,_std::char_traits<char>,_std::allocator<char>_> local_1c8;
  string local_50;
  FileDatabase *local_30;
  FileDatabase *db_local;
  size_t cnt_local;
  __shared_ptr<Assimp::Blender::ElemBase,_(__gnu_cxx::_Lock_policy)2> *p_Stack_18;
  int cdtype_local;
  shared_ptr<Assimp::Blender::ElemBase> *out_local;
  
  local_30 = db;
  db_local = (FileDatabase *)cnt;
  cnt_local._4_4_ = cdtype;
  p_Stack_18 = &out->super___shared_ptr<Assimp::Blender::ElemBase,_(__gnu_cxx::_Lock_policy)2>;
  bVar2 = isValidCustomDataType(cdtype);
  if (!bVar2) {
    this_00 = (Error *)__cxa_allocate_exception(0x10);
    Formatter::basic_formatter<char,_std::char_traits<char>,_std::allocator<char>_>::basic_formatter
              (&local_1c8);
    pbVar3 = (basic_formatter<char,std::char_traits<char>,std::allocator<char>> *)
             Formatter::basic_formatter<char,std::char_traits<char>,std::allocator<char>>::operator_
                       ((basic_formatter<char,std::char_traits<char>,std::allocator<char>> *)
                        &local_1c8,(char (*) [17])"CustomData.type ");
    pbVar3 = (basic_formatter<char,std::char_traits<char>,std::allocator<char>> *)
             Formatter::basic_formatter<char,std::char_traits<char>,std::allocator<char>>::operator_
                       (pbVar3,(int *)((long)&cnt_local + 4));
    this_01 = (basic_formatter *)
              Formatter::basic_formatter<char,std::char_traits<char>,std::allocator<char>>::
              operator_(pbVar3,(char (*) [14])" out of index");
    Formatter::basic_formatter::operator_cast_to_string(&local_50,this_01);
    Error::Error(this_00,&local_50);
    __cxa_throw(this_00,&Error::typeinfo,Error::~Error);
  }
  pvVar4 = ::std::array<Assimp::Blender::CustomDataTypeDescription,_42UL>::operator[]
                     ((array<Assimp::Blender::CustomDataTypeDescription,_42UL> *)
                      customDataTypeDescriptions,(long)cnt_local._4_4_);
  this = p_Stack_18;
  p_Var1 = pvVar4->Read;
  __d = pvVar4->Destroy;
  if ((((p_Var1 == (PRead)0x0) || (pvVar4->Create == (PCreate)0x0)) ||
      (__d == (_func_void_ElemBase_ptr *)0x0)) || (db_local == (FileDatabase *)0x0)) {
    out_local._7_1_ = false;
  }
  else {
    __p = (*pvVar4->Create)((size_t)db_local);
    ::std::__shared_ptr<Assimp::Blender::ElemBase,(__gnu_cxx::_Lock_policy)2>::
    reset<Assimp::Blender::ElemBase,void(*)(Assimp::Blender::ElemBase*)>
              ((__shared_ptr<Assimp::Blender::ElemBase,(__gnu_cxx::_Lock_policy)2> *)this,__p,__d);
    peVar5 = ::std::__shared_ptr<Assimp::Blender::ElemBase,_(__gnu_cxx::_Lock_policy)2>::get
                       (p_Stack_18);
    out_local._7_1_ = (*p_Var1)(peVar5,(size_t)db_local,local_30);
  }
  return out_local._7_1_;
}

Assistant:

bool readCustomData(std::shared_ptr<ElemBase> &out, const int cdtype, const size_t cnt, const FileDatabase &db) {
            if (!isValidCustomDataType(cdtype)) {
                throw Error((Formatter::format(), "CustomData.type ", cdtype, " out of index"));
            }

            const CustomDataTypeDescription cdtd = customDataTypeDescriptions[cdtype];
            if (cdtd.Read && cdtd.Create && cdtd.Destroy && cnt > 0) {
                // allocate cnt elements and parse them from file
                out.reset(cdtd.Create(cnt), cdtd.Destroy);
                return cdtd.Read(out.get(), cnt, db);
            }
            return false;
        }